

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8d4a5::ir_constant_propagation_visitor::constant_folding
          (ir_constant_propagation_visitor *this,ir_rvalue **rvalue)

{
  ir_rvalue *ptr;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined4 extraout_var;
  
  if (((this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
       in_assignee == false) && (*rvalue != (ir_rvalue *)0x0)) {
    bVar1 = ir_constant_fold(rvalue);
    if (bVar1) {
      this->progress = true;
    }
    ptr = *rvalue;
    if (((ptr != (ir_rvalue *)0x0) &&
        ((ptr->super_ir_instruction).ir_type == ir_type_dereference_variable)) &&
       (ptr->type->field_0x4 != '\x11')) {
      pvVar3 = ralloc_parent(ptr);
      iVar2 = (*(ptr->super_ir_instruction)._vptr_ir_instruction[6])(ptr,pvVar3,0);
      if ((ir_rvalue *)CONCAT44(extraout_var,iVar2) != (ir_rvalue *)0x0) {
        *rvalue = (ir_rvalue *)CONCAT44(extraout_var,iVar2);
        this->progress = true;
      }
    }
  }
  return;
}

Assistant:

void
ir_constant_propagation_visitor::constant_folding(ir_rvalue **rvalue)
{
   if (this->in_assignee || *rvalue == NULL)
      return;

   if (ir_constant_fold(rvalue))
      this->progress = true;

   ir_dereference_variable *var_ref = (*rvalue)->as_dereference_variable();
   if (var_ref && !var_ref->type->is_array()) {
      ir_constant *constant =
         var_ref->constant_expression_value(ralloc_parent(var_ref));
      if (constant) {
         *rvalue = constant;
         this->progress = true;
      }
   }
}